

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O2

int ARKStepSetNlsRhsFn(void *arkode_mem,ARKRhsFn nls_fi)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepSetNlsRhsFn",&local_10,&local_18);
  if (iVar1 == 0) {
    if (nls_fi == (ARKRhsFn)0x0) {
      nls_fi = local_18->fi;
    }
    local_18->nls_fi = nls_fi;
  }
  return iVar1;
}

Assistant:

int ARKStepSetNlsRhsFn(void *arkode_mem, ARKRhsFn nls_fi)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetNlsRhsFn",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  if (nls_fi)
    step_mem->nls_fi = nls_fi;
  else
    step_mem->nls_fi = step_mem->fi;

  return(ARK_SUCCESS);
}